

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parserInternals.c
# Opt level: O0

void xmlSetDeclaredEncoding(xmlParserCtxtPtr ctxt,xmlChar *encoding)

{
  bool bVar1;
  xmlParserErrors xVar2;
  uint uVar3;
  int iVar4;
  long *plStack_40;
  int match;
  char **p;
  char *autoEnc;
  char **allowed;
  xmlCharEncodingHandlerPtr pxStack_20;
  xmlParserErrors res;
  xmlCharEncodingHandlerPtr handler;
  xmlChar *encoding_local;
  xmlParserCtxtPtr ctxt_local;
  
  handler = (xmlCharEncodingHandlerPtr)encoding;
  encoding_local = (xmlChar *)ctxt;
  if (((ctxt->input->flags & 1U) == 0) && ((ctxt->options & 0x200000U) == 0)) {
    xVar2 = xmlCreateCharEncodingHandler
                      ((char *)encoding,XML_ENC_INPUT,ctxt->convImpl,ctxt->convCtxt,
                       &stack0xffffffffffffffe0);
    if (xVar2 != XML_ERR_OK) {
      xmlFatalErr((xmlParserCtxtPtr)encoding_local,xVar2,(char *)handler);
      (*xmlFree)(handler);
      return;
    }
    xVar2 = xmlInputSetEncodingHandler(*(xmlParserInputPtr *)(encoding_local + 0x38),pxStack_20);
    if (xVar2 != XML_ERR_OK) {
      xmlCtxtErrIO((xmlParserCtxtPtr)encoding_local,xVar2,(char *)0x0);
      (*xmlFree)(handler);
      return;
    }
    *(uint *)(*(long *)(encoding_local + 0x38) + 0x60) =
         *(uint *)(*(long *)(encoding_local + 0x38) + 0x60) | 0x10;
  }
  else if ((ctxt->input->flags & 0xeU) != 0) {
    autoEnc = (char *)0x0;
    p = (char **)0x0;
    uVar3 = ctxt->input->flags & 0xe;
    if (uVar3 == 2) {
      autoEnc = (char *)xmlSetDeclaredEncoding::allowedUTF8;
      p = (char **)0x249736;
    }
    else if (uVar3 == 4) {
      autoEnc = (char *)xmlSetDeclaredEncoding::allowedUTF16LE;
      p = (char **)anon_var_dwarf_2fae;
    }
    else if (uVar3 == 6) {
      autoEnc = (char *)xmlSetDeclaredEncoding::allowedUTF16BE;
      p = (char **)anon_var_dwarf_2fa4;
    }
    if (autoEnc != (char *)0x0) {
      bVar1 = false;
      for (plStack_40 = (long *)autoEnc; *plStack_40 != 0; plStack_40 = plStack_40 + 1) {
        iVar4 = xmlStrcasecmp((xmlChar *)handler,(xmlChar *)*plStack_40);
        if (iVar4 == 0) {
          bVar1 = true;
          break;
        }
      }
      if (!bVar1) {
        xmlWarningMsg((xmlParserCtxtPtr)encoding_local,XML_WAR_ENCODING_MISMATCH,
                      "Encoding \'%s\' doesn\'t match auto-detected \'%s\'\n",(xmlChar *)handler,
                      (xmlChar *)p);
        (*xmlFree)(handler);
        handler = (xmlCharEncodingHandlerPtr)xmlStrdup((xmlChar *)p);
        if (handler == (xmlCharEncodingHandlerPtr)0x0) {
          xmlCtxtErrMemory((xmlParserCtxtPtr)encoding_local);
        }
      }
    }
  }
  if (*(long *)(encoding_local + 0x28) != 0) {
    (*xmlFree)(*(void **)(encoding_local + 0x28));
  }
  *(xmlCharEncodingHandlerPtr *)(encoding_local + 0x28) = handler;
  return;
}

Assistant:

void
xmlSetDeclaredEncoding(xmlParserCtxtPtr ctxt, xmlChar *encoding) {
    if (((ctxt->input->flags & XML_INPUT_HAS_ENCODING) == 0) &&
        ((ctxt->options & XML_PARSE_IGNORE_ENC) == 0)) {
        xmlCharEncodingHandlerPtr handler;
        xmlParserErrors res;

        /*
         * xmlSwitchEncodingName treats unsupported encodings as
         * warnings, but we want it to be an error in an encoding
         * declaration.
         */
        res = xmlCreateCharEncodingHandler((const char *) encoding,
                XML_ENC_INPUT, ctxt->convImpl, ctxt->convCtxt, &handler);
        if (res != XML_ERR_OK) {
            xmlFatalErr(ctxt, res, (const char *) encoding);
            xmlFree(encoding);
            return;
        }

        res  = xmlInputSetEncodingHandler(ctxt->input, handler);
        if (res != XML_ERR_OK) {
            xmlCtxtErrIO(ctxt, res, NULL);
            xmlFree(encoding);
            return;
        }

        ctxt->input->flags |= XML_INPUT_USES_ENC_DECL;
    } else if (ctxt->input->flags & XML_INPUT_AUTO_ENCODING) {
        static const char *allowedUTF8[] = {
            "UTF-8", "UTF8", NULL
        };
        static const char *allowedUTF16LE[] = {
            "UTF-16", "UTF-16LE", "UTF16", NULL
        };
        static const char *allowedUTF16BE[] = {
            "UTF-16", "UTF-16BE", "UTF16", NULL
        };
        const char **allowed = NULL;
        const char *autoEnc = NULL;

        switch (ctxt->input->flags & XML_INPUT_AUTO_ENCODING) {
            case XML_INPUT_AUTO_UTF8:
                allowed = allowedUTF8;
                autoEnc = "UTF-8";
                break;
            case XML_INPUT_AUTO_UTF16LE:
                allowed = allowedUTF16LE;
                autoEnc = "UTF-16LE";
                break;
            case XML_INPUT_AUTO_UTF16BE:
                allowed = allowedUTF16BE;
                autoEnc = "UTF-16BE";
                break;
        }

        if (allowed != NULL) {
            const char **p;
            int match = 0;

            for (p = allowed; *p != NULL; p++) {
                if (xmlStrcasecmp(encoding, BAD_CAST *p) == 0) {
                    match = 1;
                    break;
                }
            }

            if (match == 0) {
                xmlWarningMsg(ctxt, XML_WAR_ENCODING_MISMATCH,
                              "Encoding '%s' doesn't match "
                              "auto-detected '%s'\n",
                              encoding, BAD_CAST autoEnc);
                xmlFree(encoding);
                encoding = xmlStrdup(BAD_CAST autoEnc);
                if (encoding == NULL)
                    xmlCtxtErrMemory(ctxt);
            }
        }
    }

    if (ctxt->encoding != NULL)
        xmlFree((xmlChar *) ctxt->encoding);
    ctxt->encoding = encoding;
}